

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTryTable
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TryTable *curr)

{
  value_type item;
  shared_ptr<wasm::ExnData> exnData;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            (__return_storage_ptr__,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->body);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTryTable(TryTable* curr) {
    NOTE_ENTER("TryTable");
    try {
      return self()->visit(curr->body);
    } catch (const WasmException& e) {
      auto exnData = e.exn.getExnData();
      for (size_t i = 0; i < curr->catchTags.size(); i++) {
        auto catchTag = curr->catchTags[i];
        if (!catchTag.is() || catchTag == exnData->tag) {
          Flow ret;
          ret.breakTo = curr->catchDests[i];
          if (catchTag.is()) {
            for (auto item : exnData->payload) {
              ret.values.push_back(item);
            }
          }
          if (curr->catchRefs[i]) {
            ret.values.push_back(e.exn);
          }
          return ret;
        }
      }
      // This exception is not caught by this try_table. Rethrow it.
      throw;
    }
  }